

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O2

AggregateFunction * __thiscall
duckdb::AggregateFunction::
BinaryAggregate<duckdb::ArgMinMaxState<duckdb::timestamp_t,long>,duckdb::timestamp_t,long,duckdb::timestamp_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,(duckdb::AggregateDestructorType)1>
          (AggregateFunction *__return_storage_ptr__,AggregateFunction *this,LogicalType *a_type,
          LogicalType *b_type,LogicalType *return_type)

{
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_61;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_60;
  LogicalType local_48 [24];
  LogicalType local_30 [24];
  
  duckdb::LogicalType::LogicalType(local_48,(LogicalType *)this);
  duckdb::LogicalType::LogicalType(local_30,a_type);
  __l._M_len = 2;
  __l._M_array = local_48;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_60,__l,&local_61);
  AggregateFunction(__return_storage_ptr__,(vector<duckdb::LogicalType,_true> *)&local_60,b_type,
                    StateSize<duckdb::ArgMinMaxState<duckdb::timestamp_t,long>>,
                    StateInitialize<duckdb::ArgMinMaxState<duckdb::timestamp_t,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>,(duckdb::AggregateDestructorType)1>
                    ,
                    BinaryScatterUpdate<duckdb::ArgMinMaxState<duckdb::timestamp_t,long>,duckdb::timestamp_t,long,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                    ,
                    StateCombine<duckdb::ArgMinMaxState<duckdb::timestamp_t,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                    ,
                    StateFinalize<duckdb::ArgMinMaxState<duckdb::timestamp_t,long>,duckdb::timestamp_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                    ,
                    BinaryUpdate<duckdb::ArgMinMaxState<duckdb::timestamp_t,long>,duckdb::timestamp_t,long,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                    ,(bind_aggregate_function_t)0x0,(aggregate_destructor_t)0x0,
                    (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
                    (aggregate_deserialize_t)0x0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_60);
  lVar1 = 0x18;
  do {
    duckdb::LogicalType::~LogicalType(local_48 + lVar1);
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction BinaryAggregate(const LogicalType &a_type, const LogicalType &b_type,
	                                         LogicalType return_type) {
		return AggregateFunction({a_type, b_type}, return_type, AggregateFunction::StateSize<STATE>,
		                         AggregateFunction::StateInitialize<STATE, OP, destructor_type>,
		                         AggregateFunction::BinaryScatterUpdate<STATE, A_TYPE, B_TYPE, OP>,
		                         AggregateFunction::StateCombine<STATE, OP>,
		                         AggregateFunction::StateFinalize<STATE, RESULT_TYPE, OP>,
		                         AggregateFunction::BinaryUpdate<STATE, A_TYPE, B_TYPE, OP>);
	}